

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# object_data.cpp
# Opt level: O0

void __thiscall Am_Object_Data::demon_removal(Am_Object_Data *this)

{
  Am_Object_Demon *pAVar1;
  Am_Object_Data *local_40;
  Am_Object_Data *current;
  Am_Object local_20;
  byte local_11;
  Am_Object_Data *pAStack_10;
  bool active;
  Am_Object_Data *this_local;
  
  local_11 = (byte)(this->demons_active >> 0xf);
  *(byte *)((long)&this->demons_active + 1) = *(byte *)((long)&this->demons_active + 1) & 0x7f;
  pAStack_10 = this;
  Am_Wrapper::Note_Reference(&this->super_Am_Wrapper);
  Am_Object::Am_Object(&local_20,this);
  Am_Demon_Queue::Delete(&this->demon_queue,&local_20);
  Am_Object::~Am_Object(&local_20);
  if (((local_11 & 1) != 0) && (this->demon_set->destroy_demon != (Am_Object_Demon *)0x0)) {
    Am_Wrapper::Note_Reference(&this->super_Am_Wrapper);
    pAVar1 = this->demon_set->destroy_demon;
    Am_Object::Am_Object((Am_Object *)&current,this);
    (*pAVar1)((Am_Object_Data *)&current);
    Am_Object::~Am_Object((Am_Object *)&current);
  }
  for (local_40 = this->first_part; local_40 != (Am_Object_Data *)0x0;
      local_40 = local_40->next_part) {
    demon_removal(local_40);
  }
  return;
}

Assistant:

void
Am_Object_Data::demon_removal()
{
  bool active = (demons_active & DEMONS_ACTIVE) != 0;
  demons_active &= ~DEMONS_ACTIVE;
  Note_Reference();
  demon_queue.Delete(this);
  if (active && demon_set->destroy_demon) {
    Note_Reference();
    demon_set->destroy_demon(this);
  }
  Am_Object_Data *current;
  for (current = first_part; current != nullptr; current = current->next_part)
    current->demon_removal();
}